

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O2

void __thiscall
icu_63::Calendar::computeGregorianAndDOWFields(Calendar *this,int32_t julianDay,UErrorCode *ec)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  
  computeGregorianFields(this,julianDay,ec);
  bVar1 = julianDayToDayOfWeek((double)julianDay);
  this->fFields[7] = (uint)bVar1;
  this->fStamp[7] = 1;
  this->fIsSet[7] = '\x01';
  iVar2 = (uint)bVar1 - this->fFirstDayOfWeek;
  iVar3 = iVar2 + 8;
  if (-1 < iVar2) {
    iVar3 = iVar2 + 1;
  }
  this->fStamp[0x12] = 1;
  this->fIsSet[0x12] = '\x01';
  this->fFields[0x12] = iVar3;
  return;
}

Assistant:

void Calendar::computeGregorianAndDOWFields(int32_t julianDay, UErrorCode &ec)
{
    computeGregorianFields(julianDay, ec);

    // Compute day of week: JD 0 = Monday
    int32_t dow = julianDayToDayOfWeek(julianDay);
    internalSet(UCAL_DAY_OF_WEEK,dow);

    // Calculate 1-based localized day of week
    int32_t dowLocal = dow - getFirstDayOfWeek() + 1;
    if (dowLocal < 1) {
        dowLocal += 7;
    }
    internalSet(UCAL_DOW_LOCAL,dowLocal);
    fFields[UCAL_DOW_LOCAL] = dowLocal;
}